

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# importer_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::anon_unknown_0::DiskSourceTreeTest_MapDirectory_Test::TestBody
          (DiskSourceTreeTest_MapDirectory_Test *this)

{
  reference pvVar1;
  AlphaNum *in_RCX;
  allocator<char> local_311;
  string local_310;
  allocator<char> local_2e9;
  string local_2e8;
  allocator<char> local_2c1;
  string local_2c0;
  allocator<char> local_299;
  string local_298;
  allocator<char> local_271;
  string local_270;
  allocator<char> local_249;
  string local_248;
  allocator<char> local_221;
  string local_220;
  allocator<char> local_1f9;
  string local_1f8;
  allocator<char> local_1d1;
  string local_1d0;
  allocator<char> local_1a9;
  string local_1a8;
  allocator<char> local_181;
  string local_180;
  allocator<char> local_159;
  string local_158;
  allocator<char> local_131;
  string local_130;
  allocator<char> local_109;
  string local_108;
  allocator<char> local_e1;
  string local_e0;
  string_view local_c0;
  string_view local_b0 [2];
  AlphaNum local_90;
  AlphaNum local_60;
  string local_30;
  DiskSourceTreeTest_MapDirectory_Test *local_10;
  DiskSourceTreeTest_MapDirectory_Test *this_local;
  
  local_10 = this;
  pvVar1 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[](&(this->super_DiskSourceTreeTest).dirnames_,0);
  absl::lts_20250127::AlphaNum::AlphaNum<std::allocator<char>>(&local_60,pvVar1);
  absl::lts_20250127::AlphaNum::AlphaNum(&local_90,"/foo");
  absl::lts_20250127::StrCat_abi_cxx11_(&local_30,(lts_20250127 *)&local_60,&local_90,in_RCX);
  DiskSourceTreeTest::AddFile(&this->super_DiskSourceTreeTest,&local_30,"Hello World!");
  std::__cxx11::string::~string((string *)&local_30);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(local_b0,"baz");
  pvVar1 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[](&(this->super_DiskSourceTreeTest).dirnames_,0);
  local_c0 = (string_view)std::__cxx11::string::operator_cast_to_basic_string_view((string *)pvVar1)
  ;
  DiskSourceTree::MapPath(&(this->super_DiskSourceTreeTest).source_tree_,local_b0[0],local_c0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_e0,"baz/foo",&local_e1);
  DiskSourceTreeTest::ExpectFileContents(&this->super_DiskSourceTreeTest,&local_e0,"Hello World!");
  std::__cxx11::string::~string((string *)&local_e0);
  std::allocator<char>::~allocator(&local_e1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_108,"baz/bar",&local_109);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_130,"File not found.",&local_131);
  DiskSourceTreeTest::ExpectCannotOpenFile(&this->super_DiskSourceTreeTest,&local_108,&local_130);
  std::__cxx11::string::~string((string *)&local_130);
  std::allocator<char>::~allocator(&local_131);
  std::__cxx11::string::~string((string *)&local_108);
  std::allocator<char>::~allocator(&local_109);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_158,"foo",&local_159);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_180,"File not found.",&local_181);
  DiskSourceTreeTest::ExpectCannotOpenFile(&this->super_DiskSourceTreeTest,&local_158,&local_180);
  std::__cxx11::string::~string((string *)&local_180);
  std::allocator<char>::~allocator(&local_181);
  std::__cxx11::string::~string((string *)&local_158);
  std::allocator<char>::~allocator(&local_159);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1a8,"bar",&local_1a9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1d0,"File not found.",&local_1d1);
  DiskSourceTreeTest::ExpectCannotOpenFile(&this->super_DiskSourceTreeTest,&local_1a8,&local_1d0);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::allocator<char>::~allocator(&local_1d1);
  std::__cxx11::string::~string((string *)&local_1a8);
  std::allocator<char>::~allocator(&local_1a9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1f8,"baz//foo",&local_1f9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_220,
             "Backslashes, consecutive slashes, \".\", or \"..\" are not allowed in the virtual path"
             ,&local_221);
  DiskSourceTreeTest::ExpectCannotOpenFile(&this->super_DiskSourceTreeTest,&local_1f8,&local_220);
  std::__cxx11::string::~string((string *)&local_220);
  std::allocator<char>::~allocator(&local_221);
  std::__cxx11::string::~string((string *)&local_1f8);
  std::allocator<char>::~allocator(&local_1f9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_248,"baz/../baz/foo",&local_249);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_270,
             "Backslashes, consecutive slashes, \".\", or \"..\" are not allowed in the virtual path"
             ,&local_271);
  DiskSourceTreeTest::ExpectCannotOpenFile(&this->super_DiskSourceTreeTest,&local_248,&local_270);
  std::__cxx11::string::~string((string *)&local_270);
  std::allocator<char>::~allocator(&local_271);
  std::__cxx11::string::~string((string *)&local_248);
  std::allocator<char>::~allocator(&local_249);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_298,"baz/./foo",&local_299);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2c0,
             "Backslashes, consecutive slashes, \".\", or \"..\" are not allowed in the virtual path"
             ,&local_2c1);
  DiskSourceTreeTest::ExpectCannotOpenFile(&this->super_DiskSourceTreeTest,&local_298,&local_2c0);
  std::__cxx11::string::~string((string *)&local_2c0);
  std::allocator<char>::~allocator(&local_2c1);
  std::__cxx11::string::~string((string *)&local_298);
  std::allocator<char>::~allocator(&local_299);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2e8,"baz/foo/",&local_2e9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_310,"File not found.",&local_311);
  DiskSourceTreeTest::ExpectCannotOpenFile(&this->super_DiskSourceTreeTest,&local_2e8,&local_310);
  std::__cxx11::string::~string((string *)&local_310);
  std::allocator<char>::~allocator(&local_311);
  std::__cxx11::string::~string((string *)&local_2e8);
  std::allocator<char>::~allocator(&local_2e9);
  return;
}

Assistant:

TEST_F(DiskSourceTreeTest, MapDirectory) {
  // Test opening a file in a directory that is mapped to somewhere other
  // than the root of the source tree.

  AddFile(absl::StrCat(dirnames_[0], "/foo"), "Hello World!");
  source_tree_.MapPath("baz", dirnames_[0]);

  ExpectFileContents("baz/foo", "Hello World!");
  ExpectCannotOpenFile("baz/bar", "File not found.");
  ExpectCannotOpenFile("foo", "File not found.");
  ExpectCannotOpenFile("bar", "File not found.");

  // Non-canonical file names should not work.
  ExpectCannotOpenFile("baz//foo",
                       "Backslashes, consecutive slashes, \".\", or \"..\" are "
                       "not allowed in the virtual path");
  ExpectCannotOpenFile("baz/../baz/foo",
                       "Backslashes, consecutive slashes, \".\", or \"..\" are "
                       "not allowed in the virtual path");
  ExpectCannotOpenFile("baz/./foo",
                       "Backslashes, consecutive slashes, \".\", or \"..\" are "
                       "not allowed in the virtual path");
  ExpectCannotOpenFile("baz/foo/", "File not found.");
}